

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzsfulmat.cpp
# Opt level: O0

int __thiscall
TPZSFMatrix<long_double>::Resize(TPZSFMatrix<long_double> *this,int64_t newDim,int64_t param_3)

{
  long lVar1;
  undefined1 auVar2 [16];
  long lVar3;
  ulong uVar4;
  longdouble *plVar5;
  long *plVar6;
  long in_RSI;
  long *in_RDI;
  longdouble *end;
  longdouble *dst;
  longdouble *src;
  int64_t minSize;
  longdouble *newElem;
  int64_t oldSize;
  int64_t newSize;
  char *in_stack_00000188;
  char *in_stack_00000190;
  longdouble *local_50;
  longdouble *local_48;
  long local_30;
  ulong local_28 [2];
  long local_18;
  int local_4;
  
  local_18 = in_RSI;
  lVar3 = (**(code **)(*in_RDI + 0x60))();
  if (in_RSI == lVar3) {
    local_4 = 1;
  }
  else {
    local_28[0] = (local_18 * (local_18 + 1)) / 2;
    local_30 = (**(code **)(*in_RDI + 600))();
    auVar2._8_8_ = 0;
    auVar2._0_8_ = local_28[0];
    uVar4 = SUB168(auVar2 * ZEXT816(0x10),0);
    if (SUB168(auVar2 * ZEXT816(0x10),8) != 0) {
      uVar4 = 0xffffffffffffffff;
    }
    plVar5 = (longdouble *)operator_new__(uVar4);
    if (plVar5 == (longdouble *)0x0) {
      local_4 = TPZMatrix<long_double>::Error(in_stack_00000190,in_stack_00000188);
    }
    else {
      plVar6 = Min<long>((long *)local_28,&local_30);
      lVar3 = *plVar6;
      lVar1 = in_RDI[4];
      local_50 = plVar5;
      local_48 = (longdouble *)in_RDI[4];
      while (local_48 < (longdouble *)(lVar1 + lVar3 * 0x10)) {
        *local_50 = *local_48;
        local_50 = local_50 + 1;
        local_48 = local_48 + 1;
      }
      while (local_50 < plVar5 + local_28[0]) {
        *local_50 = (longdouble)0;
        local_50 = local_50 + 1;
      }
      if ((in_RDI[4] != 0) && ((void *)in_RDI[4] != (void *)0x0)) {
        operator_delete((void *)in_RDI[4],0x10);
      }
      in_RDI[4] = (long)plVar5;
      in_RDI[2] = local_18;
      in_RDI[1] = local_18;
      *(undefined1 *)(in_RDI + 3) = 0;
      local_4 = 1;
    }
  }
  return local_4;
}

Assistant:

int
TPZSFMatrix<TVar> ::Resize( int64_t newDim , int64_t )
{
	if ( newDim == this->Dim() )
		return( 1 );
	
	int64_t newSize = newDim * (newDim + 1) / 2;
	int64_t oldSize = Size();
	TVar *newElem = new TVar[newSize] ;
	if ( newElem == NULL )
		return TPZMatrix<TVar> ::Error(__PRETTY_FUNCTION__, "Resize <memory allocation error>." );
	
	int64_t minSize  = Min( newSize, oldSize );
	TVar *src = fElem;
	TVar *dst = newElem;
	TVar *end = &fElem[ minSize ];
	
	// Copia os elementos antigos para a nova matriz.
	while ( src < end )
		*dst++ = *src++;
	
	// Preenche os elementos que sobrarem (se sobrarem) com ZEROS.
	end = &newElem[ newSize ];
	while ( dst < end )
		*dst++ = 0.0;
	
	if ( fElem != NULL )
		delete( fElem );
	fElem = newElem;
	this->fRow = this->fCol = newDim;
	this->fDecomposed = 0;
	return( 1 );
}